

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::InsertIntoIndex(QL_Manager *this,char *recbuf,RID *recRID)

{
  bool bVar1;
  RC RVar2;
  IX_IndexHandle local_85;
  undefined1 local_84 [7];
  IX_IndexHandle ih;
  AttrCatEntry aEntry;
  int i;
  RC rc;
  RID *recRID_local;
  char *recbuf_local;
  QL_Manager *this_local;
  
  aEntry.maxValue = 0.0;
  do {
    if (this->relEntries->attrCount <= (int)aEntry.maxValue) {
      return 0;
    }
    memcpy(local_84,this->attrEntries + (int)aEntry.maxValue,0x54);
    if (aEntry.attrType != ~INT) {
      IX_IndexHandle::IX_IndexHandle(&local_85);
      RVar2 = IX_Manager::OpenIndex(this->ixm,this->relEntries->relName,aEntry.attrType,&local_85);
      if (RVar2 == 0) {
        RVar2 = IX_IndexHandle::InsertEntry(&local_85,recbuf + (int)aEntry.attrName._19_4_,recRID);
        if (RVar2 == 0) {
          RVar2 = IX_Manager::CloseIndex(this->ixm,&local_85);
          if (RVar2 == 0) {
            bVar1 = false;
          }
          else {
            bVar1 = true;
            this_local._4_4_ = RVar2;
          }
        }
        else {
          bVar1 = true;
          this_local._4_4_ = RVar2;
        }
      }
      else {
        bVar1 = true;
        this_local._4_4_ = RVar2;
      }
      IX_IndexHandle::~IX_IndexHandle(&local_85);
      if (bVar1) {
        return this_local._4_4_;
      }
    }
    aEntry.maxValue = (float)((int)aEntry.maxValue + 1);
  } while( true );
}

Assistant:

RC QL_Manager::InsertIntoIndex(char *recbuf, RID recRID){
  RC rc = 0;
  for(int i = 0; i < relEntries->attrCount; i++){
    AttrCatEntry aEntry = attrEntries[i];
    if(aEntry.indexNo != -1){
      IX_IndexHandle ih;
      if((rc = ixm.OpenIndex(relEntries->relName, aEntry.indexNo, ih)))
        return (rc);
      if((rc = ih.InsertEntry((void *)(recbuf + aEntry.offset), recRID)))
        return (rc);
      if((rc = ixm.CloseIndex(ih)))
        return (rc);
    }
  }
  return (0);
}